

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_putstr(wchar_t x,wchar_t y,wchar_t n,wchar_t a,char *s)

{
  errr res;
  char *s_local;
  wchar_t a_local;
  wchar_t n_local;
  wchar_t y_local;
  wchar_t x_local;
  
  if (Term == (term *)0x0) {
    y_local = L'\0';
  }
  else {
    y_local = Term_gotoxy(x,y);
    if ((y_local == L'\0') && (y_local = Term_addstr(n,a,s), y_local == L'\0')) {
      y_local = L'\0';
    }
  }
  return y_local;
}

Assistant:

errr Term_putstr(int x, int y, int n, int a, const char *s)
{
	errr res;

	if (!Term)
		return 0;

	/* Move first */
	if ((res = Term_gotoxy(x, y)) != 0) return (res);

	/* Then add the string */
	if ((res = Term_addstr(n, a, s)) != 0) return (res);

	/* Success */
	return (0);
}